

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  long lVar1;
  uint uVar2;
  pid_t pVar3;
  gid_t gVar4;
  uid_t uVar5;
  dev_t dVar6;
  u64 uVar7;
  UnixUnusedFd **ppUVar8;
  unixInodeInfo *puVar9;
  uint uVar10;
  __pid_t _Var11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  sqlite3_io_methods *psVar15;
  UnixUnusedFd **ppUVar16;
  size_t sVar17;
  char *pcVar18;
  int *piVar19;
  unixInodeInfo **ppuVar20;
  unixInodeInfo *puVar21;
  ulong uVar22;
  uint uVar23;
  mode_t m;
  sqlite3_io_methods *psVar24;
  char *pcVar25;
  int iVar26;
  long in_FS_OFFSET;
  undefined1 auVar27 [16];
  uint local_4ac;
  gid_t gid;
  uid_t uid;
  unixFile *local_498;
  undefined4 local_48c;
  mode_t openMode;
  char cStack_484;
  char cStack_483;
  char cStack_482;
  char cStack_481;
  undefined8 uStack_480;
  sqlite3_vfs *local_470;
  char *local_468;
  ulong local_460;
  char zTmpname [514];
  char cStack_249;
  char zDb [513];
  
  pVar3 = randomnessPid;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = flags & 0xffffff00;
  if (((flags & 4U) == 0) ||
     (((local_48c = (undefined4)CONCAT71((uint7)(uint3)((uint)flags >> 8),1), uVar10 != 0x800 &&
       (uVar10 != 0x4000)) && (uVar10 != 0x80000)))) {
    local_48c = 0;
  }
  local_498 = (unixFile *)pOutFlags;
  _Var11 = getpid();
  if (pVar3 != _Var11) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pcVar25 = zPath;
  if (uVar10 == 0x100) {
    iVar12 = (*aSyscall[4].pCurrent)(zPath,zTmpname);
    if (iVar12 == 0) {
      unixEnterMutex();
      psVar15 = (sqlite3_io_methods *)0x0;
      ppuVar20 = &inodeList;
      while (puVar21 = *ppuVar20, puVar21 != (unixInodeInfo *)0x0) {
        if (((puVar21->fileId).dev == zTmpname._0_8_) && ((puVar21->fileId).ino == zTmpname._8_8_))
        {
          ppUVar8 = &puVar21->pUnused;
          goto LAB_0011597a;
        }
        ppuVar20 = &puVar21->pNext;
      }
      goto LAB_0011599a;
    }
    goto LAB_001158c2;
  }
  local_4ac = 0xffffffff;
  local_468 = zPath;
  if (zPath == (char *)0x0) {
    pcVar25 = zTmpname;
    local_4ac = 0xffffffff;
    iVar12 = unixGetTempname(pVfs->mxPathname,pcVar25);
    if (iVar12 != 0) goto LAB_00115e15;
  }
  goto LAB_001159b7;
  while (ppUVar8 = (UnixUnusedFd **)&psVar15->xClose, *(int *)&psVar15->field_0x4 != flags) {
LAB_0011597a:
    ppUVar16 = ppUVar8;
    psVar15 = (sqlite3_io_methods *)*ppUVar16;
    if (psVar15 == (sqlite3_io_methods *)0x0) {
      psVar15 = (sqlite3_io_methods *)0x0;
      goto LAB_0011599a;
    }
  }
  *ppUVar16 = (UnixUnusedFd *)psVar15->xClose;
LAB_0011599a:
  unixLeaveMutex();
  if (psVar15 == (sqlite3_io_methods *)0x0) {
LAB_001158c2:
    psVar15 = (sqlite3_io_methods *)sqlite3_malloc64(0x10);
    if (psVar15 == (sqlite3_io_methods *)0x0) {
      iVar12 = 7;
      goto LAB_00115e15;
    }
    local_4ac = 0xffffffff;
  }
  else {
    local_4ac = psVar15->iVersion;
  }
  pFile[6].pMethods = psVar15;
  local_468 = zPath;
LAB_001159b7:
  uVar22 = (ulong)(flags & 8U);
  uVar23 = flags & 1;
  iVar26 = (flags & 4U) * 0x10;
  iVar12 = iVar26 + 0x20080;
  if ((flags & 0x10U) == 0) {
    iVar12 = iVar26;
  }
  uVar2 = iVar12 + (flags & 2U);
  local_470 = pVfs;
  if ((int)local_4ac < 0) {
    _openMode = _openMode & 0xffffffff00000000;
    uid = 0;
    gid = 0;
    uVar13 = flags & 0x80800;
    local_460 = uVar22;
    if (uVar13 == 0) {
      m = 0x180;
      if ((((flags & 8U) == 0) && (m = 0, (flags & 0x40U) != 0)) &&
         (pcVar18 = sqlite3_uri_parameter(pcVar25,"modeof"), pcVar18 != (char *)0x0))
      goto LAB_00115a68;
    }
    else {
      uVar14 = sqlite3Strlen30(pcVar25);
      uVar22 = (ulong)uVar14;
      do {
        sVar17 = uVar22;
        uVar22 = sVar17 - 1;
      } while (pcVar25[sVar17 - 1] != '-');
      memcpy(zDb,pcVar25,sVar17 - 1);
      zDb[sVar17 - 1] = '\0';
      pcVar18 = zDb;
LAB_00115a68:
      iVar12 = getFileMode(pcVar18,&openMode,&uid,&gid);
      if (iVar12 != 0) goto LAB_00115e15;
      m = openMode;
    }
    local_4ac = robust_open(pcVar25,uVar2,m);
    if (-1 < (int)local_4ac) {
LAB_00115ad6:
      pVfs = local_470;
      uVar5 = uid;
      gVar4 = gid;
      uVar22 = local_460;
      if ((uVar13 != 0) && (iVar12 = (*aSyscall[0x15].pCurrent)(), uVar22 = local_460, iVar12 == 0))
      {
        (*aSyscall[0x14].pCurrent)((ulong)local_4ac,(ulong)uVar5,(ulong)gVar4);
        uVar22 = local_460;
      }
      goto LAB_00115b28;
    }
    piVar19 = __errno_location();
    if ((((flags & 2U) != 0) && (*piVar19 != 0x15)) &&
       (local_4ac = robust_open(pcVar25,uVar2 & 0x20080,m), -1 < (int)local_4ac)) {
      uVar23 = 1;
      flags = (flags & 0xfffffff8U) + 1;
      goto LAB_00115ad6;
    }
    iVar12 = sqlite3CantopenError(0x8d83);
    unixLogErrorAtLine(iVar12,"open",pcVar25,0x8d83);
LAB_00115e0c:
    sqlite3_free(((unixFile *)pFile)->pUnused);
  }
  else {
LAB_00115b28:
    pcVar25 = local_468;
    if (local_498 != (unixFile *)0x0) {
      *(int *)&local_498->pMethod = flags;
    }
    psVar15 = pFile[6].pMethods;
    if (psVar15 != (sqlite3_io_methods *)0x0) {
      psVar15->iVersion = local_4ac;
      *(int *)&psVar15->field_0x4 = flags;
    }
    iVar12 = (int)uVar22;
    if (iVar12 != 0) {
      local_498 = (unixFile *)pFile;
      (*aSyscall[0x10].pCurrent)();
      pFile = (sqlite3_file *)local_498;
    }
    uVar2 = iVar12 * 4 + 2;
    if (uVar23 == 0) {
      uVar2 = iVar12 * 4;
    }
    uVar23 = uVar2 + 0x80;
    if (uVar10 == 0x100) {
      uVar23 = uVar2;
    }
    uVar10 = uVar23 | 8;
    if ((char)local_48c == '\0') {
      uVar10 = uVar23;
    }
    ((unixFile *)pFile)->h = local_4ac;
    ((unixFile *)pFile)->pVfs = pVfs;
    ((unixFile *)pFile)->zPath = pcVar25;
    ((unixFile *)pFile)->ctrlFlags = (ushort)(flags & 0x40U) | (ushort)uVar10;
    ((unixFile *)pFile)->mmapSizeMax = sqlite3Config.szMmap;
    pcVar18 = (char *)0x0;
    if ((flags & 0x40U) != 0 || (uVar10 & 0x40) != 0) {
      pcVar18 = pcVar25;
    }
    iVar12 = sqlite3_uri_boolean(pcVar18,"psow",1);
    if (iVar12 != 0) {
      *(byte *)&((unixFile *)pFile)->ctrlFlags = (byte)((unixFile *)pFile)->ctrlFlags | 0x10;
    }
    iVar12 = strcmp(pVfs->zName,"unix-excl");
    if (iVar12 == 0) {
      *(byte *)&((unixFile *)pFile)->ctrlFlags = (byte)((unixFile *)pFile)->ctrlFlags | 1;
    }
    if ((char)uVar10 < '\0') {
      psVar15 = &nolockIoMethods;
LAB_00115c7a:
      ((unixFile *)pFile)->lastErrno = 0;
    }
    else {
      psVar15 = (sqlite3_io_methods *)(**pVfs->pAppData)(pcVar25,pFile);
      psVar24 = &posixIoMethods;
      if (psVar15 == &posixIoMethods) {
        unixEnterMutex();
        iVar12 = (*aSyscall[5].pCurrent)((ulong)(uint)((unixFile *)pFile)->h,zDb);
        if (iVar12 == 0) {
          openMode._0_1_ = zDb[0];
          openMode._1_1_ = zDb[1];
          openMode._2_1_ = zDb[2];
          openMode._3_1_ = zDb[3];
          cStack_484 = zDb[4];
          cStack_483 = zDb[5];
          cStack_482 = zDb[6];
          cStack_481 = zDb[7];
          dVar6 = _openMode;
          uStack_480._0_1_ = zDb[8];
          uStack_480._1_1_ = zDb[9];
          uStack_480._2_1_ = zDb[10];
          uStack_480._3_1_ = zDb[0xb];
          uStack_480._4_1_ = zDb[0xc];
          uStack_480._5_1_ = zDb[0xd];
          uStack_480._6_1_ = zDb[0xe];
          uStack_480._7_1_ = zDb[0xf];
          uVar7 = uStack_480;
          ppuVar20 = &inodeList;
          while (puVar21 = *ppuVar20, _openMode = dVar6, uStack_480 = uVar7,
                puVar21 != (unixInodeInfo *)0x0) {
            openMode._0_1_ = (char)zDb._0_8_;
            openMode._1_1_ = SUB81(zDb._0_8_,1);
            openMode._2_1_ = SUB81(zDb._0_8_,2);
            openMode._3_1_ = SUB81(zDb._0_8_,3);
            cStack_484 = SUB81(zDb._0_8_,4);
            cStack_483 = SUB81(zDb._0_8_,5);
            cStack_482 = SUB81(zDb._0_8_,6);
            cStack_481 = SUB81(zDb._0_8_,7);
            uStack_480._0_1_ = (char)zDb._8_8_;
            uStack_480._1_1_ = SUB81(zDb._8_8_,1);
            uStack_480._2_1_ = SUB81(zDb._8_8_,2);
            uStack_480._3_1_ = SUB81(zDb._8_8_,3);
            uStack_480._4_1_ = SUB81(zDb._8_8_,4);
            uStack_480._5_1_ = SUB81(zDb._8_8_,5);
            uStack_480._6_1_ = SUB81(zDb._8_8_,6);
            uStack_480._7_1_ = SUB81(zDb._8_8_,7);
            auVar27[0] = -((char)(puVar21->fileId).dev == (char)openMode);
            auVar27[1] = -(*(char *)((long)&(puVar21->fileId).dev + 1) == openMode._1_1_);
            auVar27[2] = -(*(char *)((long)&(puVar21->fileId).dev + 2) == openMode._2_1_);
            auVar27[3] = -(*(char *)((long)&(puVar21->fileId).dev + 3) == openMode._3_1_);
            auVar27[4] = -(*(char *)((long)&(puVar21->fileId).dev + 4) == cStack_484);
            auVar27[5] = -(*(char *)((long)&(puVar21->fileId).dev + 5) == cStack_483);
            auVar27[6] = -(*(char *)((long)&(puVar21->fileId).dev + 6) == cStack_482);
            auVar27[7] = -(*(char *)((long)&(puVar21->fileId).dev + 7) == cStack_481);
            auVar27[8] = -((char)(puVar21->fileId).ino == (char)uStack_480);
            auVar27[9] = -(*(char *)((long)&(puVar21->fileId).ino + 1) == uStack_480._1_1_);
            auVar27[10] = -(*(char *)((long)&(puVar21->fileId).ino + 2) == uStack_480._2_1_);
            auVar27[0xb] = -(*(char *)((long)&(puVar21->fileId).ino + 3) == uStack_480._3_1_);
            auVar27[0xc] = -(*(char *)((long)&(puVar21->fileId).ino + 4) == uStack_480._4_1_);
            auVar27[0xd] = -(*(char *)((long)&(puVar21->fileId).ino + 5) == uStack_480._5_1_);
            auVar27[0xe] = -(*(char *)((long)&(puVar21->fileId).ino + 6) == uStack_480._6_1_);
            auVar27[0xf] = -(*(char *)((long)&(puVar21->fileId).ino + 7) == uStack_480._7_1_);
            if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar27[0xf] >> 7) << 0xf) == 0xffff) {
              puVar21->nRef = puVar21->nRef + 1;
              puVar9 = inodeList;
              goto LAB_00115dde;
            }
            ppuVar20 = &puVar21->pNext;
          }
          puVar21 = (unixInodeInfo *)sqlite3_malloc64(0x48);
          if (puVar21 == (unixInodeInfo *)0x0) {
            iVar12 = 7;
            goto LAB_00115cbe;
          }
          puVar21->pShmNode = (unixShmNode *)0x0;
          puVar21->nLock = 0;
          *(undefined4 *)&puVar21->field_0x2c = 0;
          puVar21->nShared = 0;
          puVar21->eFileLock = '\0';
          puVar21->bProcessLock = '\0';
          *(undefined2 *)&puVar21->field_0x16 = 0;
          puVar21->nRef = 0;
          *(undefined4 *)&puVar21->field_0x1c = 0;
          puVar21->pUnused = (UnixUnusedFd *)0x0;
          (puVar21->fileId).dev = _openMode;
          (puVar21->fileId).ino = uStack_480;
          puVar21->nRef = 1;
          puVar21->pNext = inodeList;
          puVar21->pPrev = (unixInodeInfo *)0x0;
          puVar9 = puVar21;
          if (inodeList != (unixInodeInfo *)0x0) {
            inodeList->pPrev = puVar21;
          }
LAB_00115dde:
          inodeList = puVar9;
          ((unixFile *)pFile)->pInode = puVar21;
          iVar12 = 0;
        }
        else {
          piVar19 = __errno_location();
          ((unixFile *)pFile)->lastErrno = *piVar19;
          iVar12 = 10;
LAB_00115cbe:
          robust_close((unixFile *)pFile,local_4ac,0x8b95);
          local_4ac = 0xffffffff;
        }
        unixLeaveMutex();
      }
      else {
        psVar24 = &dotlockIoMethods;
        if (psVar15 != &dotlockIoMethods) goto LAB_00115c7a;
        sVar17 = strlen(pcVar25);
        iVar26 = (int)sVar17 + 6;
        pcVar18 = (char *)sqlite3_malloc64((long)iVar26);
        if (pcVar18 == (char *)0x0) {
          iVar12 = 7;
        }
        else {
          iVar12 = 0;
          sqlite3_snprintf(iVar26,pcVar18,"%s.lock",pcVar25);
        }
        ((unixFile *)pFile)->lockingContext = pcVar18;
      }
      ((unixFile *)pFile)->lastErrno = 0;
      psVar15 = psVar24;
      if (iVar12 != 0) {
        if (-1 < (int)local_4ac) {
          robust_close((unixFile *)pFile,local_4ac,0x8bea);
        }
        goto LAB_00115e0c;
      }
    }
    ((unixFile *)pFile)->pMethod = psVar15;
    verifyDbFile((unixFile *)pFile);
    iVar12 = 0;
  }
LAB_00115e15:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0xFFFFFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int syncDir = (isCreate && (
        eType==SQLITE_OPEN_MASTER_JOURNAL 
     || eType==SQLITE_OPEN_MAIN_JOURNAL 
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true: 
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and 
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and master journal are never 
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MASTER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB 
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL 
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_MASTER_JOURNAL 
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }

  memset(p, 0, sizeof(unixFile));

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !syncDir);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 && errno!=EISDIR && isReadWrite ){
      /* Failed to open the file for read/write access. Try read-only. */
      flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
      openFlags &= ~(O_RDWR|O_CREAT);
      flags |= SQLITE_OPEN_READONLY;
      openFlags |= O_RDONLY;
      isReadonly = 1;
      fd = robust_open(zName, openFlags, openMode);
    }
    if( fd<0 ){
      rc = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      goto open_finished;
    }

    /* If this process is running as root and if creating a new rollback
    ** journal or WAL file, set the ownership of the journal or WAL to be
    ** the same as the original database.
    */
    if( flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL) ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif
  
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( syncDir )                 ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means 
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile 
          ** and clear all the structure's references.  Specifically, 
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op 
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pUnused);
  }
  return rc;
}